

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcRoof::~IfcRoof(IfcRoof *this)

{
  *(undefined8 *)&this[-1].field_0x48 = 0x86b5d8;
  *(undefined8 *)&this->field_0x30 = 0x86b6f0;
  *(undefined8 *)&this[-1].field_0xd0 = 0x86b600;
  *(undefined8 *)&this[-1].field_0xe0 = 0x86b628;
  *(undefined8 *)&this[-1].field_0x118 = 0x86b650;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoof,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x86b678;
  *(undefined8 *)&this[-1].field_0x180 = 0x86b6a0;
  *(undefined8 *)this = 0x86b6c8;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
  }
  IfcElement::~IfcElement((IfcElement *)&this[-1].field_0x48,&PTR_construction_vtable_24__0086b710);
  operator_delete(&this[-1].field_0x48);
  return;
}

Assistant:

IfcRoof() : Object("IfcRoof") {}